

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprog.c
# Opt level: O1

void fight_prog_law_subdue(CHAR_DATA *mob,CHAR_DATA *ch)

{
  short sVar1;
  bool bVar2;
  int iVar3;
  CHAR_DATA *pCVar4;
  ROOM_INDEX_DATA *pRoomIndex;
  char *pcVar5;
  char *pcVar6;
  basic_string_view<char> fmt;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args;
  string buffer;
  ROOM_INDEX_DATA *pRoom;
  AFFECT_DATA af;
  CHAR_DATA *local_530;
  float local_524;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  ROOM_INDEX_DATA *local_500;
  string local_4f8;
  string local_4d8;
  string local_4b8;
  string local_498;
  string local_478;
  string local_458;
  string local_438;
  string local_418;
  string local_3f8;
  string local_3d8;
  string local_3b8;
  string local_398;
  string local_378;
  string local_358;
  string local_338;
  string local_318;
  char *local_2f8 [2];
  char *local_2e8;
  char *local_2d8;
  buffer<char> local_2c8;
  char local_2a8 [504];
  AFFECT_DATA local_b0;
  
  local_530 = ch;
  pCVar4 = get_char_room(mob,"hydra trooper soldier");
  if (((pCVar4 != (CHAR_DATA *)0x0) &&
      (pCVar4 = get_char_room(mob,"dragon trooper soldier"), pCVar4 != (CHAR_DATA *)0x0)) &&
     (bVar2 = is_affected(local_530,(int)gsn_aggressor), bVar2)) {
    local_524 = ((float)local_530->hit / (float)(int)local_530->max_hit) * 100.0 + 10.0;
    iVar3 = number_percent();
    if ((float)iVar3 <= local_524) {
      act("The troopers maneuver around you, waiting for an opening.",mob,(void *)0x0,local_530,2);
      act("The troopers maneuver around $N, waiting for an opening.",mob,(void *)0x0,local_530,1);
      return;
    }
    stop_fighting(local_530,true);
    stop_fighting(mob,true);
    mob->last_fought = (CHAR_DATA *)0x0;
    mob->tracktimer = 0;
    iVar3 = number_range(1,2);
    pcVar6 = "You crumple as the Dragon trooper lands a hefty blow on the side of your head!";
    if (iVar3 == 1) {
      pcVar6 = "The Hydra trooper dives at your legs, binding you, and you topple to the ground!";
    }
    act(pcVar6,mob,(void *)0x0,local_530,2);
    act("The troopers leap on top of you, and you find yourself quickly immobilized!",mob,
        (void *)0x0,local_530,2);
    act("The troopers leap on top of $N, and $N finds $Mself quickly immobilized!",mob,(void *)0x0,
        local_530,1);
    act("You hear the wet sounds of impact against your skull, and everything goes black.",mob,
        (void *)0x0,local_530,2);
    act("$N\'s inert form is dragged away toward the gates.",mob,(void *)0x0,local_530,1);
    local_530->position = 4;
    init_affect(&local_b0);
    local_b0.where = 0;
    local_b0.type = gsn_subdue;
    local_b0.aftype = 5;
    local_b0.bitvector[0]._2_1_ = local_b0.bitvector[0]._2_1_ | 2;
    local_b0.level = 0x3c;
    local_b0.duration = 0xc;
    affect_to_char(local_530,&local_b0);
    sVar1 = mob->pIndexData->vnum;
    switch(sVar1) {
    case 0xa8c:
      number_range(0,3);
      break;
    case 0xa8d:
    case 0xa8e:
    case 0xa90:
    case 0xa91:
    case 0xa93:
    case 0xa94:
      break;
    case 0xa8f:
      number_range(0,4);
      break;
    case 0xa92:
      number_range(0,3);
      break;
    case 0xa95:
      number_range(0,3);
      break;
    default:
      switch(sVar1) {
      case 0xa98:
        number_range(0,3);
        break;
      case 0xa99:
      case 0xa9a:
      case 0xa9c:
      case 0xa9d:
      case 0xa9f:
      case 0xaa0:
        break;
      case 0xa9b:
        number_range(0,3);
        break;
      case 0xa9e:
        number_range(0,3);
        break;
      case 0xaa1:
        number_range(0,2);
        break;
      default:
        if (sVar1 == 0x96a) {
          number_range(0,4);
        }
      }
    }
    local_500 = get_room_index(0);
    bVar2 = is_affected(local_530,(int)gsn_plasma_thread);
    if (bVar2) {
      switchD_002e4026::default(local_530,(int)gsn_plasma_thread);
    }
    char_from_room(local_530);
    pCVar4 = local_530;
    pRoomIndex = get_room_index(0);
    char_to_room(pCVar4,pRoomIndex);
    local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"fight_prog_law_subdue","")
    ;
    local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"send_to_char_queue","");
    CQueue::AddToQueue<void(*)(std::__cxx11::string,char_data*),char_const(&)[59],char_data*&>
              (&RS.Queue,10,&local_318,&local_338,send_to_char_queue,
               (char (*) [59])"You are dimly aware of being dragged along the ground...\n\r",
               &local_530);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_dataplus._M_p != &local_338.field_2) {
      operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_dataplus._M_p != &local_318.field_2) {
      operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
    }
    local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"fight_prog_law_subdue","")
    ;
    local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"wake_up","");
    CQueue::AddToQueue<void(*)(char_data*),char_data*&>
              (&RS.Queue,0x13,&local_358,&local_378,wake_up,&local_530);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._M_dataplus._M_p != &local_378.field_2) {
      operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_dataplus._M_p != &local_358.field_2) {
      operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
    }
    local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_398,"fight_prog_law_subdue","")
    ;
    local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,"affect_strip","");
    CQueue::AddToQueue<void(*)(char_data*,int),char_data*&,short&>
              (&RS.Queue,0x13,&local_398,&local_3b8,affect_strip,&local_530,&gsn_subdue);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
      operator_delete(local_3b8._M_dataplus._M_p,local_3b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._M_dataplus._M_p != &local_398.field_2) {
      operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
    }
    local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"fight_prog_law_subdue","")
    ;
    local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"char_to_room","");
    CQueue::AddToQueue<void(*)(char_data*,room_index_data*),char_data*&,room_index_data*&>
              (&RS.Queue,0x13,&local_3d8,&local_3f8,char_to_room,&local_530,&local_500);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
      operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
      operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
    }
    local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"fight_prog_law_subdue","")
    ;
    local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"char_from_room","");
    CQueue::AddToQueue<void(*)(char_data*),char_data*&>
              (&RS.Queue,0x13,&local_418,&local_438,char_from_room,&local_530);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._M_dataplus._M_p != &local_438.field_2) {
      operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_418._M_dataplus._M_p != &local_418.field_2) {
      operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
    }
    local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_458,"fight_prog_law_subdue","")
    ;
    local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"send_to_char_queue","");
    CQueue::AddToQueue<void(*)(std::__cxx11::string,char_data*),char_const(&)[79],char_data*&>
              (&RS.Queue,0x14,&local_458,&local_478,send_to_char_queue,
               (char (*) [79])
               "You are shaken awake by a fuzzy man, as seen through your own personal haze.\n\r",
               &local_530);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_478._M_dataplus._M_p != &local_478.field_2) {
      operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_458._M_dataplus._M_p != &local_458.field_2) {
      operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
    }
    local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_498,"fight_prog_law_subdue","")
    ;
    local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b8,"act_queue","");
    local_2c8._vptr_buffer = (_func_int **)0x0;
    local_2f8[0] = (char *)0x0;
    local_520._M_dataplus._M_p._0_4_ = 1;
    CQueue::
    AddToQueue<void(*)(std::__cxx11::string,char_data*,obj_data*,char_data*,int),char_const(&)[50],decltype(nullptr),decltype(nullptr),char_data*&,int>
              (&RS.Queue,0x14,&local_498,&local_4b8,act_queue,
               (char (*) [50])"$N comes to $S knees holding the back of $S head.",
               &local_2c8._vptr_buffer,local_2f8,&local_530,(int *)&local_520);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
      operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_498._M_dataplus._M_p != &local_498.field_2) {
      operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
    }
    pcVar6 = get_char_color(local_530,"tells");
    pcVar5 = get_insult(local_530);
    local_2d8 = END_COLOR(local_530);
    local_2c8.size_ = 0;
    local_2c8._vptr_buffer = (_func_int **)&PTR_grow_00457340;
    local_2c8.capacity_ = 500;
    fmt.size_ = 0x3f;
    fmt.data_ = "A Hydra trooper tells you \'{}And stay out of Cimar, ye {}!{}\'\n\r";
    args.field_1.values_ =
         (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_2f8;
    args.desc_ = 0xccc;
    local_2f8[0] = pcVar6;
    local_2e8 = pcVar5;
    local_2c8.ptr_ = local_2a8;
    ::fmt::v9::detail::vformat_to<char>(&local_2c8,fmt,args,(locale_ref)0x0);
    local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_520,local_2c8.ptr_,local_2c8.ptr_ + local_2c8.size_);
    if (local_2c8.ptr_ != local_2a8) {
      operator_delete(local_2c8.ptr_,local_2c8.capacity_);
    }
    local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d8,"fight_prog_law_subdue","")
    ;
    local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f8,"send_to_char_queue","");
    CQueue::AddToQueue<void(*)(std::__cxx11::string,char_data*),std::__cxx11::string&,char_data*&>
              (&RS.Queue,0x15,&local_4d8,&local_4f8,send_to_char_queue,&local_520,&local_530);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
      operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
      operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_520._M_dataplus._M_p != &local_520.field_2) {
      operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void fight_prog_law_subdue(CHAR_DATA *mob, CHAR_DATA *ch)
{
	CHAR_DATA *hydra, *dragon;
	int hydra_vnum, dragon_vnum, vnum = 0, num;
	ROOM_INDEX_DATA *pRoom;
	AFFECT_DATA af;
	float chance;

	switch (mob->pIndexData->vnum)
	{
		case 2410:
			hydra_vnum = 2409;
			dragon_vnum = 2408;
			break;
		default:
			dragon_vnum = mob->pIndexData->vnum + 1;
			hydra_vnum = mob->pIndexData->vnum + 2;
	}

	if (((hydra = get_char_room(mob, "hydra trooper soldier")) == nullptr)
		|| ((dragon = get_char_room(mob, "dragon trooper soldier")) == nullptr))
	{
		return;
	}

	if (!is_affected(ch, gsn_aggressor))
		return;

	chance = ((float)ch->hit / (float)ch->max_hit) * 100 + 10;

	if (number_percent() > chance)
	{
		stop_fighting(ch, true);
		stop_fighting(mob, true);

		mob->last_fought = nullptr;
		mob->tracktimer = 0;

		if (number_range(1, 2) == 1)
			act("The Hydra trooper dives at your legs, binding you, and you topple to the ground!", mob, 0, ch, TO_VICT);
		else
			act("You crumple as the Dragon trooper lands a hefty blow on the side of your head!", mob, 0, ch, TO_VICT);

		act("The troopers leap on top of you, and you find yourself quickly immobilized!", mob, 0, ch, TO_VICT);
		act("The troopers leap on top of $N, and $N finds $Mself quickly immobilized!", mob, 0, ch, TO_NOTVICT);
		act("You hear the wet sounds of impact against your skull, and everything goes black.", mob, 0, ch, TO_VICT);
		act("$N's inert form is dragged away toward the gates.", mob, 0, ch, TO_NOTVICT);

		ch->position = POS_SLEEPING;

		init_affect(&af);
		af.where = TO_AFFECTS;
		af.type = gsn_subdue;
		af.aftype = AFT_INVIS;

		SET_BIT(af.bitvector, AFF_SLEEP);

		af.level = 60;
		af.duration = 12;
		affect_to_char(ch, &af);

		switch (mob->pIndexData->vnum)
		{
			case 2410:
				num = number_range(0, 4);

				switch (num)
				{
					case 0:
						vnum = 3502;
						break;
					case 1:
						vnum = 3507;
						break;
					case 2:
						vnum = 3509;
						break;
					case 3:
						vnum = 3516;
						break;
					case 4:
						vnum = 3517;
						break;
				}

				break;
			case 2700:
				num = number_range(0, 3);

				switch (num)
				{
					case 0:
						vnum = 533;
						break;
					case 1:
						vnum = 534;
						break;
					case 2:
						vnum = 542;
						break;
					case 3:
						vnum = 551;
						break;
				}

				break;
			case 2703:
				num = number_range(0, 4);

				switch (num)
				{
					case 0:
						vnum = 528;
						break;
					case 1:
						vnum = 529;
						break;
					case 2:
						vnum = 522;
						break;
					case 3:
						vnum = 523;
						break;
					case 4:
						vnum = 524;
						break;
				}

				break;
			case 2706:
				num = number_range(0, 3);

				switch (num)
				{
					case 0:
						vnum = 2326;
						break;
					case 1:
						vnum = 2327;
						break;
					case 2:
						vnum = 2328;
						break;
					case 3:
						vnum = 2329;
						break;
				}

				break;
			case 2709:
				num = number_range(0, 3);

				switch (num)
				{
					case 0:
						vnum = 201;
						break;
					case 1:
						vnum = 202;
						break;
					case 2:
						vnum = 203;
						break;
					case 3:
						vnum = 204;
						break;
				}

				break;
			case 2712:
				num = number_range(0, 3);

				switch (num)
				{
					case 0:
						vnum = 2319;
						break;
					case 1:
						vnum = 2320;
						break;
					case 2:
						vnum = 2321;
						break;
					case 3:
						vnum = 2323;
						break;
				}

				break;
			case 2715:
				num = number_range(0, 3);

				switch (num)
				{
					case 0:
						vnum = 2331;
						break;
					case 1:
						vnum = 2332;
						break;
					case 2:
						vnum = 2333;
						break;
					case 3:
						vnum = 2334;
						break;
				}

				break;
			case 2718:
				num = number_range(0, 3);

				switch (num)
				{
					case 0:
						vnum = 6008;
						break;
					case 1:
						vnum = 6009;
						break;
					case 2:
						vnum = 6011;
						break;
					case 3:
						vnum = 6014;
						break;
				}

				break;
			case 2721:
				num = number_range(0, 2);

				switch (num)
				{
					case 0:
						vnum = 14257;
						break;
					case 1:
						vnum = 14267;
						break;
					case 2:
						vnum = 14268;
						break;
				}

				break;
		}

		pRoom = get_room_index(vnum);

		if (is_affected(ch, gsn_plasma_thread))
			affect_strip(ch, gsn_plasma_thread);

		char_from_room(ch);
		char_to_room(ch, get_room_index(5));

		RS.Queue.AddToQueue(10, "fight_prog_law_subdue", "send_to_char_queue", send_to_char_queue, "You are dimly aware of being dragged along the ground...\n\r", ch);
		RS.Queue.AddToQueue(19, "fight_prog_law_subdue", "wake_up", wake_up, ch);
		RS.Queue.AddToQueue(19, "fight_prog_law_subdue", "affect_strip", affect_strip, ch, gsn_subdue);
		RS.Queue.AddToQueue(19, "fight_prog_law_subdue", "char_to_room", char_to_room, ch, pRoom);
		RS.Queue.AddToQueue(19, "fight_prog_law_subdue", "char_from_room", char_from_room, ch);
		RS.Queue.AddToQueue(20, "fight_prog_law_subdue", "send_to_char_queue", send_to_char_queue, "You are shaken awake by a fuzzy man, as seen through your own personal haze.\n\r", ch);
		RS.Queue.AddToQueue(20, "fight_prog_law_subdue", "act_queue", act_queue, "$N comes to $S knees holding the back of $S head.", nullptr, nullptr, ch, TO_NOTVICT);

		auto buffer = fmt::format("A Hydra trooper tells you '{}And stay out of Cimar, ye {}!{}'\n\r", get_char_color(ch, "tells"), get_insult(ch), END_COLOR(ch));
		RS.Queue.AddToQueue(21, "fight_prog_law_subdue", "send_to_char_queue", send_to_char_queue, buffer, ch);
	}
	else
	{
		act("The troopers maneuver around you, waiting for an opening.", mob, 0, ch, TO_VICT);
		act("The troopers maneuver around $N, waiting for an opening.", mob, 0, ch, TO_NOTVICT);
	}
}